

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

TRANSPORT_LL_HANDLE
IoTHubTransport_MQTT_Common_Register
          (TRANSPORT_LL_HANDLE handle,IOTHUB_DEVICE_CONFIG *device,PDLIST_ENTRY waitingToSend)

{
  _Bool _Var1;
  int iVar2;
  IOTHUB_CREDENTIAL_TYPE IVar3;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  MQTTTRANSPORT_HANDLE_DATA *transport_data;
  LOGGER_LOG l;
  TRANSPORT_LL_HANDLE result;
  PDLIST_ENTRY waitingToSend_local;
  IOTHUB_DEVICE_CONFIG *device_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (((handle == (TRANSPORT_LL_HANDLE)0x0) || (device == (IOTHUB_DEVICE_CONFIG *)0x0)) ||
     (waitingToSend == (PDLIST_ENTRY)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Register",0xf4c,1,
                "IoTHubTransport_MQTT_Common_Register: handle, device or waitingToSend is NULL.");
    }
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  if (device->deviceId == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Register",0xf55,1,
                "IoTHubTransport_MQTT_Common_Register: deviceId is NULL.");
    }
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  if ((device->deviceKey != (char *)0x0) && (device->deviceSasToken != (char *)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Register",0xf5a,1,
                "IoTHubTransport_MQTT_Common_Register: Both deviceKey and deviceSasToken are defined. Only one can be used."
               );
    }
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  pcVar5 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x40));
  iVar2 = strcmp(pcVar5,device->deviceId);
  if (iVar2 != 0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Register",0xf61,1,
                "IoTHubTransport_MQTT_Common_Register: deviceId does not match.");
    }
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  pcVar5 = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x48));
  _Var1 = checkModuleIdsEqual(pcVar5,device->moduleId);
  if (!_Var1) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Register",0xf66,1,
                "IoTHubTransport_MQTT_Common_Register: moduleId does not match.");
    }
    return (TRANSPORT_LL_HANDLE)0x0;
  }
  IVar3 = IoTHubClient_Auth_Get_Credential_Type
                    (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118));
  if (IVar3 == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
    if (device->deviceKey != (char *)0x0) {
      pcVar5 = IoTHubClient_Auth_Get_DeviceKey
                         (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118));
      iVar2 = strcmp(pcVar5,device->deviceKey);
      if (iVar2 == 0) goto LAB_00137dfd;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Register",0xf6c,1,
                "IoTHubTransport_MQTT_Common_Register: deviceKey does not match.");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
LAB_00137dfd:
    if ((*(byte *)((long)handle + 0x84) & 1) == 1) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"IoTHubTransport_MQTT_Common_Register",0xf73,1,
                  "Transport already has device registered by id: [%s]",device->deviceId);
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      *(undefined1 *)((long)handle + 0x84) = 1;
      l = (LOGGER_LOG)handle;
    }
  }
  return l;
}

Assistant:

TRANSPORT_LL_HANDLE IoTHubTransport_MQTT_Common_Register(TRANSPORT_LL_HANDLE handle, const IOTHUB_DEVICE_CONFIG* device, PDLIST_ENTRY waitingToSend)
{
    TRANSPORT_LL_HANDLE result = NULL;

    if ((handle == NULL) || (device == NULL) || (waitingToSend == NULL))
    {
        LogError("IoTHubTransport_MQTT_Common_Register: handle, device or waitingToSend is NULL.");
        result = NULL;
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* transport_data = (MQTTTRANSPORT_HANDLE_DATA*)handle;

        if (device->deviceId == NULL)
        {
            LogError("IoTHubTransport_MQTT_Common_Register: deviceId is NULL.");
            result = NULL;
        }
        else if ((device->deviceKey != NULL) && (device->deviceSasToken != NULL))
        {
            LogError("IoTHubTransport_MQTT_Common_Register: Both deviceKey and deviceSasToken are defined. Only one can be used.");
            result = NULL;
        }
        else
        {
            if (strcmp(STRING_c_str(transport_data->device_id), device->deviceId) != 0)
            {
                LogError("IoTHubTransport_MQTT_Common_Register: deviceId does not match.");
                result = NULL;
            }
            else if (!checkModuleIdsEqual(STRING_c_str(transport_data->module_id), device->moduleId))
            {
                LogError("IoTHubTransport_MQTT_Common_Register: moduleId does not match.");
                result = NULL;
            }
            else if (IoTHubClient_Auth_Get_Credential_Type(transport_data->authorization_module) == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY &&
                ((device->deviceKey == NULL) || (strcmp(IoTHubClient_Auth_Get_DeviceKey(transport_data->authorization_module), device->deviceKey) != 0)))
            {
                LogError("IoTHubTransport_MQTT_Common_Register: deviceKey does not match.");
                result = NULL;
            }
            else
            {
                if (transport_data->isRegistered == true)
                {
                    LogError("Transport already has device registered by id: [%s]", device->deviceId);
                    result = NULL;
                }
                else
                {
                    transport_data->isRegistered = true;
                    result = (TRANSPORT_LL_HANDLE)handle;
                }
            }
        }
    }

    return result;
}